

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::java::IsReferenceType(JavaType type)

{
  LogMessage *this;
  undefined4 in_EDI;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffffa0;
  LogMessage *in_stack_ffffffffffffffb0;
  LogMessage local_40;
  bool local_1;
  
  switch(in_EDI) {
  case 0:
    local_1 = false;
    break;
  case 1:
    local_1 = false;
    break;
  case 2:
    local_1 = false;
    break;
  case 3:
    local_1 = false;
    break;
  case 4:
    local_1 = false;
    break;
  case 5:
    local_1 = true;
    break;
  case 6:
    local_1 = true;
    break;
  case 7:
    local_1 = true;
    break;
  case 8:
    local_1 = true;
    break;
  default:
    other = &local_40;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffffb0,LOGLEVEL_INFO,(char *)in_stack_ffffffffffffffa0,
               (int)((ulong)other >> 0x20));
    this = internal::LogMessage::operator<<(in_stack_ffffffffffffffa0,(char *)other);
    internal::LogFinisher::operator=((LogFinisher *)this,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x45c2e1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IsReferenceType(JavaType type) {
  switch (type) {
    case JAVATYPE_INT:
      return false;
    case JAVATYPE_LONG:
      return false;
    case JAVATYPE_FLOAT:
      return false;
    case JAVATYPE_DOUBLE:
      return false;
    case JAVATYPE_BOOLEAN:
      return false;
    case JAVATYPE_STRING:
      return true;
    case JAVATYPE_BYTES:
      return true;
    case JAVATYPE_ENUM:
      return true;
    case JAVATYPE_MESSAGE:
      return true;

      // No default because we want the compiler to complain if any new
      // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return false;
}